

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

optional<long>
kratos::convert_value
          (Var *var,optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *values)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  const_reference __t;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  optional<long> oVar3;
  int64_t *s_v;
  value_type *v;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *values_local;
  Var *var_local;
  bool local_10;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)values);
  if (bVar1) {
    this = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator*
                     (values);
    __t = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,0);
    bVar1 = Var::is_signed(var);
    if (bVar1) {
      std::optional<long>::optional<const_long_&,_true>((optional<long> *)&var_local,(long *)__t);
      uVar2 = extraout_RDX_00;
    }
    else {
      std::optional<long>::optional<const_unsigned_long_&,_true>((optional<long> *)&var_local,__t);
      uVar2 = extraout_RDX_01;
    }
  }
  else {
    std::optional<long>::optional((optional<long> *)&var_local);
    uVar2 = extraout_RDX;
  }
  oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = local_10;
  oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)var_local;
  return (optional<long>)
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> convert_value(const Var *var,
                                     const std::optional<std::vector<uint64_t>> &values) {
    if (!values) {
        return std::nullopt;
    }
    auto const *v = &((*values)[0]);
    if (var->is_signed()) {
        auto const *s_v = reinterpret_cast<const int64_t *>(v);
        return *s_v;
    } else {
        return *v;
    }
}